

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void aom_filter_block1d4_h4_ssse3
               (uint8_t *src_ptr,ptrdiff_t src_pixels_per_line,uint8_t *output_ptr,
               ptrdiff_t output_pitch,uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t local_27c;
  undefined4 local_278;
  uint8_t *local_200;
  undefined1 (*local_1f0) [16];
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  uint i;
  __m128i srcRegFilt32b1_1;
  __m128i srcReg32b1;
  __m128i firstFilters;
  __m128i filt1Reg;
  __m128i addFilterReg32;
  __m128i filtersReg;
  int16_t *filter_local;
  uint32_t output_height_local;
  
  local_1f0 = (undefined1 (*) [16])(src_ptr + -3);
  auVar2 = psraw(*(undefined1 (*) [16])filter,ZEXT416(1));
  auVar3 = packsswb(auVar2,auVar2);
  auVar2._8_8_ = 0x504030205040302;
  auVar2._0_8_ = 0x504030205040302;
  auVar2 = pshufb(auVar3,auVar2);
  local_200 = output_ptr;
  for (local_27c = output_height; local_27c != 0; local_27c = local_27c - 1) {
    auVar3[8] = '\x04';
    auVar3[9] = '\x05';
    auVar3[10] = '\x06';
    auVar3[0xb] = '\a';
    auVar3[0xc] = '\x05';
    auVar3[0xd] = '\x06';
    auVar3[0xe] = '\a';
    auVar3[0xf] = '\b';
    auVar3[0] = '\x02';
    auVar3[1] = '\x03';
    auVar3[2] = '\x04';
    auVar3[3] = '\x05';
    auVar3[4] = '\x03';
    auVar3[5] = '\x04';
    auVar3[6] = '\x05';
    auVar3[7] = '\x06';
    auVar3 = pshufb(*local_1f0,auVar3);
    auVar3 = pmaddubsw(auVar3,auVar2);
    auVar3 = phaddsw(auVar3,ZEXT816(0));
    auVar1._8_8_ = 0x20002000200020;
    auVar1._0_8_ = 0x20002000200020;
    auVar3 = paddsw(auVar3,auVar1);
    auVar3 = psraw(auVar3,ZEXT416(6));
    local_1d8 = auVar3._0_2_;
    sStack_1d6 = auVar3._2_2_;
    sStack_1d4 = auVar3._4_2_;
    sStack_1d2 = auVar3._6_2_;
    local_278 = CONCAT13((0 < sStack_1d2) * (sStack_1d2 < 0x100) * auVar3[6] - (0xff < sStack_1d2),
                         CONCAT12((0 < sStack_1d4) * (sStack_1d4 < 0x100) * auVar3[4] -
                                  (0xff < sStack_1d4),
                                  CONCAT11((0 < sStack_1d6) * (sStack_1d6 < 0x100) * auVar3[2] -
                                           (0xff < sStack_1d6),
                                           (0 < local_1d8) * (local_1d8 < 0x100) * auVar3[0] -
                                           (0xff < local_1d8))));
    local_1f0 = (undefined1 (*) [16])(*local_1f0 + src_pixels_per_line);
    *(undefined4 *)local_200 = local_278;
    local_200 = local_200 + output_pitch;
  }
  return;
}

Assistant:

static void aom_filter_block1d4_h4_ssse3(
    const uint8_t *src_ptr, ptrdiff_t src_pixels_per_line, uint8_t *output_ptr,
    ptrdiff_t output_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m128i addFilterReg32, filt1Reg, firstFilters, srcReg32b1, srcRegFilt32b1_1;
  unsigned int i;
  src_ptr -= 3;
  addFilterReg32 = _mm_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  // converting the 16 bit (short) to 8 bit (byte) and have the same data
  // in both lanes of 128 bit register.
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);

  firstFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi32(0x5040302u));
  filt1Reg = _mm_load_si128((__m128i const *)(filtd4));

  for (i = output_height; i > 0; i -= 1) {
    // load the 2 strides of source
    srcReg32b1 = _mm_loadu_si128((const __m128i *)src_ptr);

    // filter the source buffer
    srcRegFilt32b1_1 = _mm_shuffle_epi8(srcReg32b1, filt1Reg);

    // multiply 4 adjacent elements with the filter and add the result
    srcRegFilt32b1_1 = _mm_maddubs_epi16(srcRegFilt32b1_1, firstFilters);

    srcRegFilt32b1_1 = _mm_hadds_epi16(srcRegFilt32b1_1, _mm_setzero_si128());

    // shift by 6 bit each 16 bit
    srcRegFilt32b1_1 = _mm_adds_epi16(srcRegFilt32b1_1, addFilterReg32);
    srcRegFilt32b1_1 = _mm_srai_epi16(srcRegFilt32b1_1, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve result
    srcRegFilt32b1_1 = _mm_packus_epi16(srcRegFilt32b1_1, _mm_setzero_si128());

    src_ptr += src_pixels_per_line;

    *((int *)(output_ptr)) = _mm_cvtsi128_si32(srcRegFilt32b1_1);
    output_ptr += output_pitch;
  }
}